

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

StructUnionMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StructUnionMemberSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,DataTypeSyntax *args_2,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_3,Token *args_4)

{
  Token semi;
  StructUnionMemberSyntax *pSVar1;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_RDI;
  DataTypeSyntax *unaff_retaddr;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000008;
  StructUnionMemberSyntax *in_stack_00000010;
  undefined1 in_stack_00000018 [16];
  undefined2 uStack0000000000000030;
  undefined1 uStack0000000000000032;
  undefined1 uStack0000000000000033;
  undefined4 uStack0000000000000034;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pSVar1 = (StructUnionMemberSyntax *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  semi.info = (Info *)args_4;
  semi.kind = uStack0000000000000030;
  semi._2_1_ = uStack0000000000000032;
  semi.numFlags.raw = uStack0000000000000033;
  semi.rawLen = uStack0000000000000034;
  slang::syntax::StructUnionMemberSyntax::StructUnionMemberSyntax
            (in_stack_00000010,in_stack_00000008,(Token)in_stack_00000018,unaff_retaddr,in_RDI,semi)
  ;
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }